

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall Assimp::IFC::Schema_2x3::IfcFaceBound::IfcFaceBound(IfcFaceBound *this,void **vtt)

{
  _func_int **pp_Var1;
  void *pvVar2;
  
  pp_Var1 = (_func_int **)vtt[3];
  (this->super_IfcTopologicalRepresentationItem).super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       pp_Var1;
  *(void **)((long)&(this->super_IfcTopologicalRepresentationItem).super_IfcRepresentationItem.
                    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
                    _vptr_ObjectHelper + (long)pp_Var1[-3]) = vtt[4];
  pp_Var1 = (_func_int **)vtt[2];
  (this->super_IfcTopologicalRepresentationItem).super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       pp_Var1;
  *(void **)((long)&(this->super_IfcTopologicalRepresentationItem).super_IfcRepresentationItem.
                    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
                    _vptr_ObjectHelper + (long)pp_Var1[-3]) = vtt[5];
  pvVar2 = vtt[6];
  *(void **)&(this->super_IfcTopologicalRepresentationItem).super_IfcRepresentationItem.
             super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 =
       pvVar2;
  *(void **)(&(this->super_IfcTopologicalRepresentationItem).super_IfcRepresentationItem.
              super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 +
            *(long *)((long)pvVar2 + -0x18)) = vtt[7];
  pp_Var1 = (_func_int **)vtt[1];
  (this->super_IfcTopologicalRepresentationItem).super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       pp_Var1;
  *(void **)((long)&(this->super_IfcTopologicalRepresentationItem).super_IfcRepresentationItem.
                    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
                    _vptr_ObjectHelper + (long)pp_Var1[-3]) = vtt[8];
  *(void **)&(this->super_IfcTopologicalRepresentationItem).super_IfcRepresentationItem.
             super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 =
       vtt[9];
  pvVar2 = vtt[10];
  *(void **)&(this->super_IfcTopologicalRepresentationItem).super_IfcRepresentationItem.
             super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 =
       pvVar2;
  *(void **)(&(this->super_IfcTopologicalRepresentationItem).super_IfcRepresentationItem.
              super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 +
            *(long *)((long)pvVar2 + -0x18)) = vtt[0xb];
  *(undefined8 *)&(this->super_IfcTopologicalRepresentationItem).field_0x28 = 0;
  pp_Var1 = (_func_int **)*vtt;
  (this->super_IfcTopologicalRepresentationItem).super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       pp_Var1;
  *(void **)((long)&(this->super_IfcTopologicalRepresentationItem).super_IfcRepresentationItem.
                    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
                    _vptr_ObjectHelper + (long)pp_Var1[-3]) = vtt[0xc];
  *(void **)&(this->super_IfcTopologicalRepresentationItem).super_IfcRepresentationItem.
             super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 =
       vtt[0xd];
  *(void **)&(this->super_IfcTopologicalRepresentationItem).super_IfcRepresentationItem.
             super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 =
       vtt[0xe];
  *(undefined8 *)&(this->super_IfcTopologicalRepresentationItem).field_0x30 = 0;
  (this->Orientation)._M_dataplus._M_p = (pointer)&(this->Orientation).field_2;
  (this->Orientation)._M_string_length = 0;
  (this->Orientation).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

IfcFaceBound() : Object("IfcFaceBound") {}